

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_noderel.cc
# Opt level: O0

RC __thiscall QL_NodeRel::RetrieveNextRec(QL_NodeRel *this,RM_Record *rec,char **recData)

{
  bool bVar1;
  RC RVar2;
  RID local_34;
  RID rid;
  RC rc;
  char **recData_local;
  RM_Record *rec_local;
  QL_NodeRel *this_local;
  
  rid.page = 0;
  unique0x100000e0 = recData;
  if ((this->useIndex & 1U) == 0) {
    RVar2 = RM_FileScan::GetNextRec(&this->fs,rec);
    if (RVar2 != 0) {
      return RVar2;
    }
    rid.page = 0;
  }
  else {
    RID::RID(&local_34);
    rid.page = IX_IndexScan::GetNextEntry(&this->is,&local_34);
    if (rid.page == 0) {
      rid.page = RM_FileHandle::GetRec(&this->fh,&local_34,rec);
      if (rid.page == 0) {
        bVar1 = false;
      }
      else {
        bVar1 = true;
        this_local._4_4_ = rid.page;
      }
    }
    else {
      bVar1 = true;
      this_local._4_4_ = rid.page;
    }
    RID::~RID(&local_34);
    if (bVar1) {
      return this_local._4_4_;
    }
  }
  this_local._4_4_ = RM_Record::GetData(rec,stack0xffffffffffffffd8);
  if (this_local._4_4_ == 0) {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

RC QL_NodeRel::RetrieveNextRec(RM_Record &rec, char *&recData){
  RC rc = 0;
  if(useIndex){
    RID rid;
    if((rc = is.GetNextEntry(rid) ))
      return (rc);
    if((rc = fh.GetRec(rid, rec) ))
      return (rc);
  }
  else{
    if((rc = fs.GetNextRec(rec)))
      return (rc);
  }
  if((rc = rec.GetData(recData)))
    return (rc);
  return (0);
}